

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O2

bool __thiscall google::protobuf::io::CodedOutputStream::HadError(CodedOutputStream *this)

{
  uint8 *puVar1;
  LogMessage *other;
  LogMessage local_58;
  LogFinisher local_19;
  
  puVar1 = EpsCopyOutputStream::FlushAndResetBuffer(&this->impl_,this->cur_);
  this->cur_ = puVar1;
  if (puVar1 == (uint8 *)0x0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/io/coded_stream.h"
               ,0x426);
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: cur_: ");
    internal::LogFinisher::operator=(&local_19,other);
    internal::LogMessage::~LogMessage(&local_58);
  }
  return (this->impl_).had_error_;
}

Assistant:

bool HadError() {
    cur_ = impl_.FlushAndResetBuffer(cur_);
    GOOGLE_DCHECK(cur_);
    return impl_.HadError();
  }